

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDataBarExpandedBitDecoder.cpp
# Opt level: O1

string * ZXing::OneD::DataBar::DecodeCompressedGTIN
                   (string *__return_storage_ptr__,string *prefix,BitArrayView *bits)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  uint uVar4;
  undefined8 in_RCX;
  int iVar5;
  string local_50;
  
  iVar5 = 4;
  do {
    uVar4 = BitArrayView::peakBits(bits,10);
    (bits->cur)._M_current = (bits->cur)._M_current + 10;
    ToString<int,void>(&local_50,(ZXing *)(ulong)uVar4,3,(int)in_RCX);
    std::__cxx11::string::_M_append((char *)prefix,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)prefix);
  GTIN::ComputeCheckDigit<char>(&local_50,false);
  std::__cxx11::string::push_back((char)prefix);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (prefix->_M_dataplus)._M_p;
  paVar1 = &prefix->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&prefix->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = prefix->_M_string_length;
  (prefix->_M_dataplus)._M_p = (pointer)paVar1;
  prefix->_M_string_length = 0;
  (prefix->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static std::string DecodeCompressedGTIN(std::string prefix, BitArrayView& bits)
{
	for (int i = 0; i < 4; ++i)
		prefix.append(ToString(bits.readBits(10), 3));

	prefix.push_back(GTIN::ComputeCheckDigit(prefix.substr(2)));

	return prefix;
}